

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmsio.c
# Opt level: O0

int FmsIOWriteFmsDataCollection(FmsIOContext *ctx,FmsIOFunctions *io,char *key,FmsDataCollection dc)

{
  int iVar1;
  char *pcVar2;
  FmsIOFunctions *io_00;
  FmsDataCollection in_RCX;
  FmsMesh in_RDX;
  char *in_RSI;
  FmsIOFunctions *in_RDI;
  FmsMetaData unaff_retaddr;
  char *md_key;
  char *m_key;
  char *fi_key;
  char tmp_1 [20];
  char *nfs_key;
  char *f_key;
  char *fdi_key;
  char tmp [20];
  char *nfds_key;
  char *fd_key;
  char *n_key;
  char *name;
  FmsInt i;
  FmsInt num_fields;
  FmsInt num_fds;
  FmsMetaData md;
  FmsField *fields;
  FmsFieldDescriptor *fds;
  FmsMesh mesh;
  int err;
  char *in_stack_ffffffffffffff18;
  char *in_stack_ffffffffffffff20;
  char *k1;
  char local_d8 [24];
  char *local_c0;
  char *local_b8;
  char *local_b0;
  char local_a8 [24];
  FmsField in_stack_ffffffffffffff70;
  FmsIOContext *in_stack_ffffffffffffff88;
  FmsIOFunctions *io_01;
  FmsIOContext *ctx_00;
  ulong uVar3;
  FmsInt local_60;
  FmsIOContext *local_58;
  FmsMetaData local_50;
  FmsField *local_48;
  FmsFieldDescriptor *local_40;
  FmsMesh local_38;
  int local_2c;
  FmsDataCollection local_28;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  local_2c = 0;
  local_40 = (FmsFieldDescriptor *)0x0;
  local_58 = (FmsIOContext *)0x0;
  local_60 = 0;
  io_01 = (FmsIOFunctions *)0x0;
  local_28 = in_RCX;
  iVar1 = FmsDataCollectionGetName(in_RCX,(char **)&stack0xffffffffffffff90);
  if (iVar1 == 0) {
    in_stack_ffffffffffffff88 =
         (FmsIOContext *)join_keys(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    local_2c = (**(code **)(in_RSI + 0x40))(in_RDI,in_stack_ffffffffffffff88,io_01);
    if (in_stack_ffffffffffffff88 != (FmsIOContext *)0x0) {
      free(in_stack_ffffffffffffff88);
    }
    if (local_2c != 0) {
      return 1;
    }
  }
  iVar1 = FmsDataCollectionGetFieldDescriptors(local_28,&local_40,(FmsInt *)&local_58);
  if (iVar1 == 0) {
    pcVar2 = join_keys(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    iVar1 = (**(code **)(in_RSI + 0x10))(in_RDI,pcVar2,local_58);
    if (iVar1 == 0) {
      if (pcVar2 != (char *)0x0) {
        free(pcVar2);
      }
      io_00 = (FmsIOFunctions *)join_keys(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
      for (ctx_00 = (FmsIOContext *)0x0; ctx_00 < local_58 && local_2c == 0;
          ctx_00 = (FmsIOContext *)((long)&ctx_00->fp + 1)) {
        local_b0 = (char *)0x0;
        sprintf(local_a8,"%d",(ulong)ctx_00 & 0xffffffff);
        local_b0 = join_keys(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
        local_2c = FmsIOWriteFmsFieldDescriptor
                             (ctx_00,io_01,(char *)in_stack_ffffffffffffff88,
                              (FmsFieldDescriptor)io_00);
        if (local_b0 != (char *)0x0) {
          free(local_b0);
        }
      }
      if (io_00 != (FmsIOFunctions *)0x0) {
        free(io_00);
      }
      if (local_2c == 0) {
        iVar1 = FmsDataCollectionGetFields(local_28,&local_48,&local_60);
        if (iVar1 == 0) {
          local_b8 = (char *)0x0;
          local_c0 = (char *)0x0;
          local_c0 = join_keys(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
          iVar1 = (**(code **)(in_RSI + 0x10))(in_RDI,local_c0,local_60);
          if (iVar1 == 0) {
            if (local_c0 != (char *)0x0) {
              free(local_c0);
            }
            local_b8 = join_keys(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
            for (uVar3 = 0; uVar3 < local_60 && local_2c == 0; uVar3 = uVar3 + 1) {
              k1 = (char *)0x0;
              sprintf(local_d8,"%d",uVar3 & 0xffffffff);
              in_stack_ffffffffffffff20 = join_keys(k1,in_stack_ffffffffffffff18);
              local_2c = FmsIOWriteFmsField(in_stack_ffffffffffffff88,io_00,pcVar2,
                                            in_stack_ffffffffffffff70);
              if (in_stack_ffffffffffffff20 != (char *)0x0) {
                free(in_stack_ffffffffffffff20);
              }
            }
            if (local_b8 != (char *)0x0) {
              free(local_b8);
            }
            if (local_2c == 0) {
              iVar1 = FmsDataCollectionGetMesh(local_28,&local_38);
              if (iVar1 == 0) {
                pcVar2 = join_keys(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
                local_2c = FmsIOWriteFmsMesh((FmsIOContext *)
                                             CONCAT44(in_stack_fffffffffffffffc,
                                                      in_stack_fffffffffffffff8),in_RDI,in_RSI,
                                             in_RDX);
                if (pcVar2 != (char *)0x0) {
                  free(pcVar2);
                }
                if (local_2c == 0) {
                  iVar1 = FmsDataCollectionGetMetaData(local_28,&local_50);
                  if (iVar1 == 0) {
                    if (local_50 != (FmsMetaData)0x0) {
                      pcVar2 = join_keys(in_stack_ffffffffffffff20,pcVar2);
                      local_2c = FmsIOWriteFmsMetaData
                                           ((FmsIOContext *)fi_key,(FmsIOFunctions *)m_key,md_key,
                                            unaff_retaddr);
                      if (pcVar2 != (char *)0x0) {
                        free(pcVar2);
                      }
                      if (local_2c != 0) {
                        return 10;
                      }
                    }
                    iVar1 = 0;
                  }
                  else {
                    iVar1 = 0xb;
                  }
                }
                else {
                  iVar1 = 8;
                }
              }
              else {
                iVar1 = 9;
              }
            }
            else {
              iVar1 = 6;
            }
          }
          else {
            if (local_c0 != (char *)0x0) {
              free(local_c0);
            }
            iVar1 = 5;
          }
        }
        else {
          iVar1 = 7;
        }
      }
      else {
        iVar1 = 3;
      }
    }
    else {
      if (pcVar2 != (char *)0x0) {
        free(pcVar2);
      }
      iVar1 = 2;
    }
  }
  else {
    iVar1 = 4;
  }
  return iVar1;
}

Assistant:

static int
FmsIOWriteFmsDataCollection(FmsIOContext *ctx, FmsIOFunctions *io,
                            const char *key,
                            FmsDataCollection dc) {
  int err = 0;
  FmsMesh mesh;
  FmsFieldDescriptor *fds = NULL;
  FmsField *fields;
  FmsMetaData md;
  FmsInt num_fds = 0, num_fields = 0;
  FmsInt i;
  const char *name = NULL;

  /** NOTE: FmsDataCollection does not provide a method to get the name. We need one. */
  if(FmsDataCollectionGetName(dc, &name) == 0) {
    char *n_key = join_keys(key, "Name");
    err = (*io->add_string)(ctx, n_key, name);
    FREE(n_key);
    if(err)
      E_RETURN(1);
  }

  if(FmsDataCollectionGetFieldDescriptors(dc, &fds, &num_fds) == 0) {
    char *fd_key = NULL, *nfds_key = NULL;

    nfds_key = join_keys(key, "NumberOfFieldDescriptors");
    if((*io->add_int)(ctx, nfds_key, num_fds) != 0) {
      FREE(nfds_key);
      E_RETURN(2);
    }
    FREE(nfds_key);

    fd_key = join_keys(key, "FieldDescriptors");
    for(i = 0; i < num_fds && err == 0; ++i) {
      char tmp[20], *fdi_key = NULL;
      sprintf(tmp, "%d", (int)i);
      fdi_key = join_keys(fd_key, tmp);

      /* Writing DataCollection/FieldDescriptors/0/... */
      err = FmsIOWriteFmsFieldDescriptor(ctx, io, fdi_key, fds[i]);

      FREE(fdi_key);
    }

    FREE(fd_key);
    if(err)
      E_RETURN(3);
  } else {
    E_RETURN(4);
  }

  if(FmsDataCollectionGetFields(dc, &fields, &num_fields) == 0) {
    char *f_key = NULL, *nfs_key = NULL;
    nfs_key = join_keys(key, "NumberOfFields");
    if((*io->add_int)(ctx, nfs_key, num_fields) != 0) {
      FREE(nfs_key);
      E_RETURN(5);
    }
    FREE(nfs_key);

    f_key = join_keys(key, "Fields");
    for(i = 0; i < num_fields && err == 0; ++i) {
      char tmp[20], *fi_key = NULL;
      sprintf(tmp, "%d", (int)i);
      fi_key = join_keys(f_key, tmp);

      err = FmsIOWriteFmsField(ctx, io, fi_key, fields[i]);

      FREE(fi_key);
    }

    FREE(f_key);
    if(err)
      E_RETURN(6);
  } else {
    E_RETURN(7);
  }

  if(FmsDataCollectionGetMesh(dc, &mesh) == 0) {
    char *m_key = join_keys(key, "Mesh");
    err = FmsIOWriteFmsMesh(ctx, io, m_key, mesh);
    FREE(m_key);
    if(err)
      E_RETURN(8);
  } else {
    E_RETURN(9);
  }

  if(FmsDataCollectionGetMetaData(dc, &md) == 0) {
    if(md) {
      char *md_key = join_keys(key, "MetaData");
      err = FmsIOWriteFmsMetaData(ctx, io, md_key, md);
      FREE(md_key);
      if(err)
        E_RETURN(10);
    }
  } else {
    E_RETURN(11);
  }

  return 0;
}